

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
::~raw_hash_set(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::vector<int,_std::allocator<int>_>,_int>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                *this)

{
  void *p;
  size_t n;
  
  if ((this->settings_).
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
      .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
      capacity_ != 0) {
    destroy_slots(this);
    if ((this->settings_).
        super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
        .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
        capacity_ == 0) {
      __assert_fail("(capacity() != 0) && \"Try enabling sanitizers.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe4f,
                    "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, absl::hash_internal::Hash<std::vector<int>>, std::equal_to<std::vector<int>>, std::allocator<std::pair<const std::vector<int>, int>>>::dealloc() [Policy = absl::container_internal::FlatHashMapPolicy<std::vector<int>, int>, Hash = absl::hash_internal::Hash<std::vector<int>>, Eq = std::equal_to<std::vector<int>>, Alloc = std::allocator<std::pair<const std::vector<int>, int>>]"
                   );
    }
    if (((this->settings_).
         super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
         .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
         size_ & 1) != 0) {
      CommonFields::backing_array_start((CommonFields *)this);
    }
    p = CommonFields::backing_array_start((CommonFields *)this);
    n = CommonFields::alloc_size((CommonFields *)this,0x20,8);
    Deallocate<8ul,std::allocator<std::pair<std::vector<int,std::allocator<int>>const,int>>>
              ((allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_> *)this,p,n)
    ;
  }
  (this->settings_).
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0xffffffffffffff9d;
  return;
}

Assistant:

~raw_hash_set() {
    destructor_impl();
#ifndef NDEBUG
    common().set_capacity(InvalidCapacity::kDestroyed);
#endif
  }